

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

ssize_t Curl_h1_req_parse_read
                  (h1_req_parser *parser,char *buf,size_t buflen,char *scheme_default,int options,
                  CURLcode *err)

{
  CURLcode CVar1;
  ssize_t sVar2;
  ssize_t n;
  ssize_t nread;
  CURLcode *err_local;
  int options_local;
  char *scheme_default_local;
  size_t buflen_local;
  char *buf_local;
  h1_req_parser *parser_local;
  
  n = 0;
  *err = CURLE_OK;
  scheme_default_local = (char *)buflen;
  buflen_local = (size_t)buf;
  while( true ) {
    if (((parser->done ^ 0xffU) & 1) == 0) {
      return n;
    }
    sVar2 = next_line(parser,(char *)buflen_local,(size_t)scheme_default_local,options,err);
    if (sVar2 < 0) break;
    n = sVar2 + n;
    buflen_local = sVar2 + buflen_local;
    scheme_default_local = scheme_default_local + -sVar2;
    if (parser->line == (char *)0x0) {
      if (scheme_default_local == (char *)0x0) {
        return n;
      }
    }
    else if (parser->req == (httpreq *)0x0) {
      CVar1 = start_req(parser,scheme_default,options);
      *err = CVar1;
      if (*err != CURLE_OK) {
        return -1;
      }
    }
    else if (parser->line_len == 0) {
      if (parser->req == (httpreq *)0x0) {
        *err = CURLE_URL_MALFORMAT;
        return -1;
      }
      parser->done = true;
      Curl_dyn_reset(&parser->scratch);
    }
    else {
      CVar1 = Curl_dynhds_h1_add_line(&parser->req->headers,parser->line,parser->line_len);
      *err = CVar1;
      if (*err != CURLE_OK) {
        return -1;
      }
    }
  }
  if (*err != CURLE_AGAIN) {
    n = -1;
  }
  *err = CURLE_OK;
  return n;
}

Assistant:

ssize_t Curl_h1_req_parse_read(struct h1_req_parser *parser,
                               const char *buf, size_t buflen,
                               const char *scheme_default, int options,
                               CURLcode *err)
{
  ssize_t nread = 0, n;

  *err = CURLE_OK;
  while(!parser->done) {
    n = next_line(parser, buf, buflen, options, err);
    if(n < 0) {
      if(*err != CURLE_AGAIN) {
        nread = -1;
      }
      *err = CURLE_OK;
      goto out;
    }

    /* Consume this line */
    nread += (size_t)n;
    buf += (size_t)n;
    buflen -= (size_t)n;

    if(!parser->line) {
      /* consumed bytes, but line not complete */
      if(!buflen)
        goto out;
    }
    else if(!parser->req) {
      *err = start_req(parser, scheme_default, options);
      if(*err) {
        nread = -1;
        goto out;
      }
    }
    else if(parser->line_len == 0) {
      /* last, empty line, we are finished */
      if(!parser->req) {
        *err = CURLE_URL_MALFORMAT;
        nread = -1;
        goto out;
      }
      parser->done = TRUE;
      Curl_dyn_reset(&parser->scratch);
      /* last chance adjustments */
    }
    else {
      *err = Curl_dynhds_h1_add_line(&parser->req->headers,
                                     parser->line, parser->line_len);
      if(*err) {
        nread = -1;
        goto out;
      }
    }
  }

out:
  return nread;
}